

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O3

XXH_errorcode XXH64_update(XXH64_state_t *state_in,void *input,size_t len)

{
  ulong uVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  long *plVar4;
  unsigned_long_long uVar5;
  unsigned_long_long uVar6;
  ulong uVar7;
  
  state_in->total_len = state_in->total_len + len;
  uVar1 = (ulong)state_in->memsize;
  if (uVar1 + len < 0x20) {
    memcpy((void *)((long)state_in->mem64 + uVar1),input,len);
    uVar1 = (ulong)((int)len + state_in->memsize);
  }
  else {
    plVar4 = (long *)(len + (long)input);
    if (uVar1 != 0) {
      memcpy((void *)((long)state_in->mem64 + uVar1),input,(ulong)(0x20 - state_in->memsize));
      uVar1 = state_in->mem64[0] * -0x3d4d51c2d82b14b1 + state_in->v1;
      state_in->v1 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      uVar1 = state_in->mem64[1] * -0x3d4d51c2d82b14b1 + state_in->v2;
      state_in->v2 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      uVar1 = state_in->mem64[2] * -0x3d4d51c2d82b14b1 + state_in->v3;
      state_in->v3 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      uVar1 = state_in->mem64[3] * -0x3d4d51c2d82b14b1 + state_in->v4;
      state_in->v4 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
      input = (void *)((long)input + (ulong)(0x20 - state_in->memsize));
      state_in->memsize = 0;
    }
    if ((long *)((long)input + 0x20) <= plVar4) {
      uVar2 = state_in->v1;
      uVar3 = state_in->v2;
      uVar6 = state_in->v3;
      uVar5 = state_in->v4;
      do {
        uVar1 = *input * -0x3d4d51c2d82b14b1 + uVar2;
        uVar2 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        uVar1 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + uVar3;
        uVar7 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + uVar6;
        uVar3 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        uVar6 = (uVar7 * 0x80000000 | uVar7 >> 0x21) * -0x61c8864e7a143579;
        uVar1 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + uVar5;
        uVar5 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x61c8864e7a143579;
        input = (void *)((long)input + 0x20);
      } while (input <= plVar4 + -4);
      state_in->v1 = uVar2;
      state_in->v2 = uVar3;
      state_in->v3 = uVar6;
      state_in->v4 = uVar5;
    }
    if (plVar4 <= input) {
      return XXH_OK;
    }
    uVar1 = (long)plVar4 - (long)input;
    memcpy(state_in->mem64,input,uVar1);
  }
  state_in->memsize = (uint)uVar1;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_update (XXH64_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH64_update_endian(state_in, input, len, XXH_bigEndian);
}